

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall Catch::AssertionResultData::~AssertionResultData(AssertionResultData *this)

{
  AssertionResultData *this_local;
  
  std::__cxx11::string::~string((string *)&this->reconstructedExpression);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

AssertionResultData() = delete;